

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O1

void __thiscall
asio::detail::
timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::up_heap(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *this,size_t index)

{
  pointer phVar1;
  pointer phVar2;
  duration dVar3;
  per_timer_data *ppVar4;
  per_timer_data *ppVar5;
  ulong uVar6;
  
  while( true ) {
    if (index == 0) {
      return;
    }
    uVar6 = index - 1 >> 1;
    phVar2 = (this->heap_).
             super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (phVar2[uVar6].time_.__d.__r <= phVar2[index].time_.__d.__r) break;
    phVar1 = phVar2 + index;
    dVar3.__r = (phVar1->time_).__d.__r;
    ppVar4 = phVar1->timer_;
    ppVar5 = phVar2[uVar6].timer_;
    (phVar1->time_).__d.__r = phVar2[uVar6].time_.__d.__r;
    phVar1->timer_ = ppVar5;
    phVar2 = (this->heap_).
             super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar6;
    (phVar2->time_).__d.__r = dVar3.__r;
    phVar2->timer_ = ppVar4;
    phVar2 = (this->heap_).
             super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (phVar2[index].timer_)->heap_index_ = index;
    (phVar2[uVar6].timer_)->heap_index_ = uVar6;
    index = uVar6;
  }
  return;
}

Assistant:

void up_heap(std::size_t index)
  {
    while (index > 0)
    {
      std::size_t parent = (index - 1) / 2;
      if (!Time_Traits::less_than(heap_[index].time_, heap_[parent].time_))
        break;
      swap_heap(index, parent);
      index = parent;
    }
  }